

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void block_free_heap(AD *ad)

{
  ulongi uVar1;
  AD *ad2;
  AD **ppAVar2;
  _func_Boolean_AD_ptr_AD_ptr *pred;
  AD *pAVar3;
  code *list;
  AD *max_ad;
  AD *pAVar4;
  
  pAVar4 = (AD *)0x0;
  ppAVar2 = &ma_hused;
  while (pAVar3 = *ppAVar2, pAVar3 != (AD *)0x0) {
    if (pAVar4 < pAVar3) {
      pAVar4 = pAVar3;
    }
    ppAVar2 = &pAVar3->next;
  }
  if (pAVar4 == (AD *)0x0) {
    ma_hp = ma_segment;
    ma_hfree = (AD *)0x0;
  }
  else {
    ma_hp = pAVar4->name + (pAVar4->nbytes - 0x10);
    list = ad_gt;
    list_delete_many(&ma_hfree,ad_gt,(Pointer)pAVar4,(_func_void_AD_ptr *)0x0);
    if (ad < pAVar4) {
      list_insert_ordered(ad,(AD **)list,pred);
      pAVar4 = ma_hfree;
      while (pAVar3 = pAVar4, pAVar3 != (AD *)0x0) {
        uVar1 = pAVar3->nbytes;
        pAVar4 = pAVar3->next;
        if ((_AD *)(pAVar3->name + (uVar1 - 0x10)) == pAVar3->next) {
          pAVar3->nbytes = *(long *)(pAVar3->name + uVar1 + 0x28) + uVar1;
          pAVar3->next = *(_AD **)(pAVar3->name + uVar1 + 0x30);
          pAVar4 = pAVar3;
        }
      }
    }
  }
  return;
}

Assistant:

private void block_free_heap(ad)
    AD        *ad;        /* AD to free */
{
    AD        *ad2;        /* traversal pointer */
    AD        *max_ad;    /* rightmost AD */

    /* find rightmost heap block */
    for (max_ad = (AD *)NULL, ad2 = ma_hused; ad2; ad2 = ad2->next)
    {
        if (ad2 > max_ad)
            max_ad = ad2;
    }

    if (max_ad)
    {
        /* at least 1 block is in use */

        /* set ma_hp to first address past end of max_ad */
        ma_hp = (Pointer)max_ad + max_ad->nbytes;

        /* delete any free list blocks that are no longer in heap region */
	void (*action)(AD *);
	action= NULL;
        (void)list_delete_many(
            &ma_hfree,
            ad_gt,
            (Pointer)max_ad,
            action);

        /* if ad is in the heap region, add it to free list */
        if (ad < max_ad)
        {
            list_insert_ordered(ad, &ma_hfree, ad_lt);
            list_coalesce(ma_hfree);
        }
    }
    else
    {
        /* no blocks are in use */

        /* set ma_hp to start of segment */
        ma_hp = ma_segment;

        /* clear the free list */
        ma_hfree = (AD *)NULL;
    }
}